

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

bool __thiscall JetHead::Socket::setKeepAlive(Socket *this,int timeout)

{
  int iVar1;
  int line;
  char *fmt;
  int probes;
  int interval;
  int aliveTime;
  int one;
  
  interval = 5;
  probes = (timeout + 4) / 5;
  one = 1;
  aliveTime = interval;
  iVar1 = setsockopt(this->mFd,1,9,&one,4);
  if (iVar1 == 0) {
    iVar1 = setsockopt(this->mFd,6,4,&aliveTime,4);
    if (iVar1 == 0) {
      iVar1 = setsockopt(this->mFd,6,5,&interval,4);
      if (iVar1 == 0) {
        iVar1 = setsockopt(this->mFd,6,6,&probes,4);
        if (iVar1 == 0) {
          return true;
        }
        fmt = "Failed keepcnt";
        iVar1 = 2;
        line = 0x2d0;
      }
      else {
        fmt = "Failed keepintvl";
        iVar1 = 2;
        line = 0x2c8;
      }
    }
    else {
      fmt = "Failed keepidle";
      iVar1 = 3;
      line = 0x2c0;
    }
  }
  else {
    fmt = "Failed to set SO_KEEPALIVE";
    iVar1 = 3;
    line = 0x2b8;
  }
  jh_log_print(iVar1,"bool JetHead::Socket::setKeepAlive(int)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
               ,line,fmt);
  return false;
}

Assistant:

bool Socket::setKeepAlive(int timeout)
{
#ifdef PLATFORM_DARWIN
	return false;
#else
	// How long must the connection be idle before we start the
	// keepalive checking?
	int aliveTime = 5;

	// At what interval (in seconds) do we send out addtional probes?
	int interval = 5;
	
	// The number of probes is the timeout / interval, rounded up.
	int probes = (timeout + (interval - 1)) / interval;

	// setsockopt requires pointers to values, thus lame
	int one = 1;

	// First we have to set SO_KEEPALIVE so that the socket layer
	// knows that there are keepalive options.  (The details of those
	// options are protocol specific.)
	if ( setsockopt(mFd, SOL_SOCKET, SO_KEEPALIVE, &one, 
					sizeof(one)) != 0 )
	{
		LOG_WARN_PERROR("Failed to set SO_KEEPALIVE");
		return false;
	}

	// Set the idle time
	if ( setsockopt(mFd, IPPROTO_TCP, TCP_KEEPIDLE, &aliveTime, 
					sizeof(aliveTime)) != 0 )
	{
		LOG_WARN_PERROR("Failed keepidle");
		return false;
	}

	// Set the probe interval
	if (setsockopt( mFd, IPPROTO_TCP, TCP_KEEPINTVL, &interval, 
					sizeof(interval)) != 0 )
	{
		LOG_WARN("Failed keepintvl");
		return false;
	}

	// Set the number of probes
	if (setsockopt( mFd, IPPROTO_TCP, TCP_KEEPCNT, &probes,     
					sizeof(probes)) != 0 )
	{
		LOG_WARN("Failed keepcnt");
		return false;
	}
	
	// We win
	return true;
#endif
}